

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::TicketAEADMethodTest_Resume_Test::TestBody
          (TicketAEADMethodTest_Resume_Test *this)

{
  uint16_t version_00;
  uint retry_count_00;
  ssl_test_ticket_aead_failure_mode failure_mode_00;
  bool bVar1;
  int iVar2;
  SSL_METHOD *method;
  char *pcVar3;
  SSL_METHOD *meth;
  pointer psVar4;
  ParamType *pPVar5;
  __tuple_element_t<0UL,_tuple<unsigned_short,_unsigned_int,_ssl_test_ticket_aead_failure_mode>_>
  *p_Var6;
  __tuple_element_t<1UL,_tuple<unsigned_short,_unsigned_int,_ssl_test_ticket_aead_failure_mode>_>
  *p_Var7;
  __tuple_element_t<2UL,_tuple<unsigned_short,_unsigned_int,_ssl_test_ticket_aead_failure_mode>_>
  *p_Var8;
  pointer psVar9;
  pointer server_00;
  pointer psVar10;
  pointer session_00;
  char *in_R9;
  string local_598;
  AssertHelper local_578;
  Message local_570;
  bool local_561;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_530;
  Message local_528;
  bool local_519;
  undefined1 local_518 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_4e8;
  Message local_4e0;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_4a8;
  Message local_4a0;
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_460;
  Message local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_418;
  Message local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_3d0;
  Message local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__11;
  Message local_3a8;
  undefined1 local_3a0 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker_1;
  UniquePtr<SSL_SESSION> session;
  AssertHelper local_360;
  Message local_358;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_318;
  Message local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_240;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__6;
  Message local_218;
  undefined1 local_210 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  AssertHelper local_1c8;
  Message local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_180;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_138;
  Message local_130;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_f0;
  Message local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__2;
  ssl_test_ticket_aead_failure_mode failure_mode;
  uint retry_count;
  uint16_t version;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<SSL_CTX> client_ctx;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> server_ctx;
  TicketAEADMethodTest_Resume_Test *this_local;
  
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&gtest_ar_.message_,method);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)"server_ctx","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1621,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (!bVar1) goto LAB_001ebe45;
  meth = (SSL_METHOD *)TLS_method();
  psVar4 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,psVar4);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_88,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&retry_count,(internal *)local_88,(AssertionResult *)"client_ctx","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1623,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&retry_count);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (bVar1) {
    pPVar5 = testing::
             WithParamInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
             ::GetParam();
    p_Var6 = std::
             get<0ul,unsigned_short,unsigned_int,bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                       (pPVar5);
    version_00 = *p_Var6;
    pPVar5 = testing::
             WithParamInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
             ::GetParam();
    p_Var7 = std::
             get<1ul,unsigned_short,unsigned_int,bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                       (pPVar5);
    retry_count_00 = *p_Var7;
    pPVar5 = testing::
             WithParamInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
             ::GetParam();
    p_Var8 = std::
             get<2ul,unsigned_short,unsigned_int,bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                       (pPVar5);
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = *p_Var8;
    psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
    local_dc = SSL_CTX_set_min_proto_version(psVar4,version_00);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_d8,&local_dc,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3.message_,(internal *)local_d8,
                 (AssertionResult *)"SSL_CTX_set_min_proto_version(client_ctx.get(), version)",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x162a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    if (bVar1) {
      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      local_124 = SSL_CTX_set_max_proto_version(psVar4,version_00);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_120,&local_124,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
      if (!bVar1) {
        testing::Message::Message(&local_130);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__4.message_,(internal *)local_120,
                   (AssertionResult *)"SSL_CTX_set_max_proto_version(client_ctx.get(), version)",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x162b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,&local_130);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
        testing::Message::~Message(&local_130);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
      if (bVar1) {
        psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        local_16c = SSL_CTX_set_min_proto_version(psVar4,version_00);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_168,&local_16c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
        if (!bVar1) {
          testing::Message::Message(&local_178);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_168,
                     (AssertionResult *)"SSL_CTX_set_min_proto_version(server_ctx.get(), version)",
                     "false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x162c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_180,&local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_178);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
        if (bVar1) {
          psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                             );
          local_1b4 = SSL_CTX_set_max_proto_version(psVar4,version_00);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1b0,&local_1b4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
          if (!bVar1) {
            testing::Message::Message(&local_1c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&client,(internal *)local_1b0,
                       (AssertionResult *)"SSL_CTX_set_max_proto_version(server_ctx.get(), version)"
                       ,"false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x162d,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
            testing::internal::AssertHelper::~AssertHelper(&local_1c8);
            std::__cxx11::string::~string((string *)&client);
            testing::Message::~Message(&local_1c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
          if (bVar1) {
            psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            SSL_CTX_set_session_cache_mode(psVar4,3);
            psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            SSL_CTX_set_session_cache_mode(psVar4,3);
            psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            SSL_CTX_set_current_time_cb(psVar4,FrozenTimeCallback);
            psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            SSL_CTX_set_current_time_cb(psVar4,FrozenTimeCallback);
            psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar4,SaveLastSession);
            psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            SSL_CTX_set_ticket_aead_method
                      (psVar4,(SSL_TICKET_AEAD_METHOD *)(anonymous_namespace)::kSSLTestTicketMethod)
            ;
            std::unique_ptr<ssl_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
            std::unique_ptr<ssl_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<ssl_st,bssl::internal::Deleter> *)
                       &gtest_fatal_failure_checker.original_reporter_);
            bVar1 = testing::internal::AlwaysTrue();
            if (bVar1) {
              testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                        ((HasNewFatalFailureHelper *)local_210);
              bVar1 = testing::internal::AlwaysTrue();
              if (bVar1) {
                psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__1.message_);
                psVar10 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                     &gtest_ar_.message_);
                in_R9 = (char *)(ulong)gtest_ar__2.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_;
                ConnectClientAndServerWithTicketMethod
                          (&server,(UniquePtr<SSL> *)&gtest_fatal_failure_checker.original_reporter_
                           ,psVar4,psVar10,retry_count_00,
                           gtest_ar__2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,(SSL_SESSION *)0x0);
              }
              bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                                ((HasNewFatalFailureHelper *)local_210);
              testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                        ((HasNewFatalFailureHelper *)local_210);
              if (bVar1) {
                if (bVar1) goto LAB_001ea98e;
              }
              else {
                if (gtest_ar__2.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == ssl_test_ticket_aead_ok) {
LAB_001eaa69:
                  testing::AssertionResult::
                  AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
                            ((AssertionResult *)local_230,&server,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_230);
                  if (!bVar1) {
                    testing::Message::Message(&local_238);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__7.message_,(internal *)local_230,
                               (AssertionResult *)0x4f1d96,"false","true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_240,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x163f,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_240,&local_238);
                    testing::internal::AssertHelper::~AssertHelper(&local_240);
                    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                    testing::Message::~Message(&local_238);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
                  if (!bVar1) goto LAB_001ebe24;
                }
                else {
                  if (gtest_ar__2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == ssl_test_ticket_aead_seal_fail) {
                    local_271 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&server);
                    local_271 = !local_271;
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_270,&local_271,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_270);
                    if (!bVar1) {
                      testing::Message::Message(&local_280);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__8.message_,(internal *)local_270,
                                 (AssertionResult *)0x4f1d96,"true","false",in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_288,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x1642,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_288,&local_280);
                      testing::internal::AssertHelper::~AssertHelper(&local_288);
                      std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                      testing::Message::~Message(&local_280);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
                    goto LAB_001ebe24;
                  }
                  if (gtest_ar__2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == ssl_test_ticket_aead_open_soft_fail ||
                      gtest_ar__2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == ssl_test_ticket_aead_open_hard_fail) goto LAB_001eaa69;
                }
                psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
                iVar2 = SSL_session_reused(psVar9);
                local_2b9 = iVar2 == 0;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2b8);
                if (!bVar1) {
                  testing::Message::Message(&local_2c8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__9.message_,(internal *)local_2b8,
                             (AssertionResult *)"SSL_session_reused(client.get())","true","false",
                             in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2d0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1645,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
                  testing::internal::AssertHelper::~AssertHelper(&local_2d0);
                  std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                  testing::Message::~Message(&local_2c8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                    &gtest_fatal_failure_checker.original_reporter_);
                iVar2 = SSL_session_reused(psVar9);
                local_301 = iVar2 == 0;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_300,&local_301,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_300);
                if (!bVar1) {
                  testing::Message::Message(&local_310);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__10.message_,(internal *)local_300,
                             (AssertionResult *)"SSL_session_reused(server.get())","true","false",
                             in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_318,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1646,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_318,&local_310);
                  testing::internal::AssertHelper::~AssertHelper(&local_318);
                  std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                  testing::Message::~Message(&local_310);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
                psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
                server_00 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                       &gtest_fatal_failure_checker.original_reporter_);
                local_349 = FlushNewSessionTickets(psVar9,server_00);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_348,&local_349,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_348);
                if (!bVar1) {
                  testing::Message::Message(&local_358);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&session,(internal *)local_348,
                             (AssertionResult *)"FlushNewSessionTickets(client.get(), server.get())"
                             ,"false","true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_360,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1648,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_360,&local_358);
                  testing::internal::AssertHelper::~AssertHelper(&local_360);
                  std::__cxx11::string::~string((string *)&session);
                  testing::Message::~Message(&local_358);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
                if (bVar1) {
                  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::unique_ptr
                            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                             &gtest_fatal_failure_checker_1.original_reporter_,
                             (unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                             &(anonymous_namespace)::g_last_session);
                  bVar1 = testing::internal::AlwaysTrue();
                  if (bVar1) {
                    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                              ((HasNewFatalFailureHelper *)local_3a0);
                    bVar1 = testing::internal::AlwaysTrue();
                    if (bVar1) {
                      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__1.message_);
                      psVar10 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                           &gtest_ar_.message_);
                      failure_mode_00 =
                           gtest_ar__2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_;
                      session_00 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *
                                              )&gtest_fatal_failure_checker_1.original_reporter_);
                      in_R9 = (char *)(ulong)failure_mode_00;
                      ConnectClientAndServerWithTicketMethod
                                (&server,(UniquePtr<SSL> *)
                                         &gtest_fatal_failure_checker.original_reporter_,psVar4,
                                 psVar10,retry_count_00,failure_mode_00,session_00);
                    }
                    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                                      ((HasNewFatalFailureHelper *)local_3a0);
                    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                              ((HasNewFatalFailureHelper *)local_3a0);
                    if (bVar1) {
                      if (bVar1) goto LAB_001eb33c;
                    }
                    else {
                      switch(gtest_ar__2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_) {
                      case ssl_test_ticket_aead_ok:
                        testing::AssertionResult::
                        AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
                                  ((AssertionResult *)local_3c0,&server,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_3c0);
                        if (!bVar1) {
                          testing::Message::Message(&local_3c8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__12.message_,(internal *)local_3c0,
                                     (AssertionResult *)0x4f1d96,"false","true",in_R9);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_3d0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x164f,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
                          testing::internal::AssertHelper::~AssertHelper(&local_3d0);
                          std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                          testing::Message::~Message(&local_3c8);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
                        if (bVar1) {
                          psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
                          local_404 = SSL_session_reused(psVar9);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_400,&local_404,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_400);
                          if (!bVar1) {
                            testing::Message::Message(&local_410);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__13.message_,(internal *)local_400,
                                       (AssertionResult *)"SSL_session_reused(client.get())","false"
                                       ,"true",in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_418,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1650,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_418,&local_410);
                            testing::internal::AssertHelper::~AssertHelper(&local_418);
                            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                            testing::Message::~Message(&local_410);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
                          psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                              &gtest_fatal_failure_checker.original_reporter_);
                          local_44c = SSL_session_reused(psVar9);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_448,&local_44c,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_448);
                          if (!bVar1) {
                            testing::Message::Message(&local_458);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__14.message_,(internal *)local_448,
                                       (AssertionResult *)"SSL_session_reused(server.get())","false"
                                       ,"true",in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_460,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1651,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_460,&local_458);
                            testing::internal::AssertHelper::~AssertHelper(&local_460);
                            std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                            testing::Message::~Message(&local_458);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
                        }
                        break;
                      case ssl_test_ticket_aead_seal_fail:
                        abort();
                      case ssl_test_ticket_aead_open_soft_fail:
                        testing::AssertionResult::
                        AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
                                  ((AssertionResult *)local_4d8,&server,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_4d8);
                        if (!bVar1) {
                          testing::Message::Message(&local_4e0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__16.message_,(internal *)local_4d8,
                                     (AssertionResult *)0x4f1d96,"false","true",in_R9);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_4e8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x165a,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
                          testing::internal::AssertHelper::~AssertHelper(&local_4e8);
                          std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                          testing::Message::~Message(&local_4e0);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
                        if (bVar1) {
                          psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
                          iVar2 = SSL_session_reused(psVar9);
                          local_519 = iVar2 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_518,&local_519,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_518);
                          if (!bVar1) {
                            testing::Message::Message(&local_528);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__17.message_,(internal *)local_518,
                                       (AssertionResult *)"SSL_session_reused(client.get())","true",
                                       "false",in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_530,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x165b,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_530,&local_528);
                            testing::internal::AssertHelper::~AssertHelper(&local_530);
                            std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                            testing::Message::~Message(&local_528);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
                          psVar9 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                              &gtest_fatal_failure_checker.original_reporter_);
                          iVar2 = SSL_session_reused(psVar9);
                          local_561 = iVar2 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_560,&local_561,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_560);
                          if (!bVar1) {
                            testing::Message::Message(&local_570);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      (&local_598,(internal *)local_560,
                                       (AssertionResult *)"SSL_session_reused(server.get())","true",
                                       "false",in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_578,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x165c,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_578,&local_570);
                            testing::internal::AssertHelper::~AssertHelper(&local_578);
                            std::__cxx11::string::~string((string *)&local_598);
                            testing::Message::~Message(&local_570);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
                        }
                        break;
                      case ssl_test_ticket_aead_open_hard_fail:
                        local_491 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&server);
                        local_491 = !local_491;
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_490,&local_491,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_490);
                        if (!bVar1) {
                          testing::Message::Message(&local_4a0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__15.message_,(internal *)local_490,
                                     (AssertionResult *)0x4f1d96,"true","false",in_R9);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_4a8,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x1657,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
                          testing::internal::AssertHelper::~AssertHelper(&local_4a8);
                          std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                          testing::Message::~Message(&local_4a0);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
                      }
                    }
                  }
                  else {
LAB_001eb33c:
                    testing::Message::Message(&local_3a8);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__11.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x164c,
                               "Expected: ConnectClientAndServerWithTicketMethod( &client, &server, client_ctx.get(), server_ctx.get(), retry_count, failure_mode, session.get()) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                              );
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__11.message_,&local_3a8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar__11.message_);
                    testing::Message::~Message(&local_3a8);
                  }
                  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                             &gtest_fatal_failure_checker_1.original_reporter_);
                }
              }
            }
            else {
LAB_001ea98e:
              testing::Message::Message(&local_218);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x163a,
                         "Expected: ConnectClientAndServerWithTicketMethod( &client, &server, client_ctx.get(), server_ctx.get(), retry_count, failure_mode, nullptr) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                        );
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__6.message_,&local_218);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_218);
            }
LAB_001ebe24:
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                       &gtest_fatal_failure_checker.original_reporter_);
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
          }
        }
      }
    }
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
LAB_001ebe45:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_P(TicketAEADMethodTest, Resume) {
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);

  const uint16_t version = testing::get<0>(GetParam());
  const unsigned retry_count = testing::get<1>(GetParam());
  const ssl_test_ticket_aead_failure_mode failure_mode =
      testing::get<2>(GetParam());

  ASSERT_TRUE(SSL_CTX_set_min_proto_version(client_ctx.get(), version));
  ASSERT_TRUE(SSL_CTX_set_max_proto_version(client_ctx.get(), version));
  ASSERT_TRUE(SSL_CTX_set_min_proto_version(server_ctx.get(), version));
  ASSERT_TRUE(SSL_CTX_set_max_proto_version(server_ctx.get(), version));

  SSL_CTX_set_session_cache_mode(client_ctx.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_current_time_cb(client_ctx.get(), FrozenTimeCallback);
  SSL_CTX_set_current_time_cb(server_ctx.get(), FrozenTimeCallback);
  SSL_CTX_sess_set_new_cb(client_ctx.get(), SaveLastSession);

  SSL_CTX_set_ticket_aead_method(server_ctx.get(), &kSSLTestTicketMethod);

  bssl::UniquePtr<SSL> client, server;
  ASSERT_NO_FATAL_FAILURE(ConnectClientAndServerWithTicketMethod(
      &client, &server, client_ctx.get(), server_ctx.get(), retry_count,
      failure_mode, nullptr));
  switch (failure_mode) {
    case ssl_test_ticket_aead_ok:
    case ssl_test_ticket_aead_open_hard_fail:
    case ssl_test_ticket_aead_open_soft_fail:
      ASSERT_TRUE(client);
      break;
    case ssl_test_ticket_aead_seal_fail:
      EXPECT_FALSE(client);
      return;
  }
  EXPECT_FALSE(SSL_session_reused(client.get()));
  EXPECT_FALSE(SSL_session_reused(server.get()));

  ASSERT_TRUE(FlushNewSessionTickets(client.get(), server.get()));
  bssl::UniquePtr<SSL_SESSION> session = std::move(g_last_session);
  ASSERT_NO_FATAL_FAILURE(ConnectClientAndServerWithTicketMethod(
      &client, &server, client_ctx.get(), server_ctx.get(), retry_count,
      failure_mode, session.get()));
  switch (failure_mode) {
    case ssl_test_ticket_aead_ok:
      ASSERT_TRUE(client);
      EXPECT_TRUE(SSL_session_reused(client.get()));
      EXPECT_TRUE(SSL_session_reused(server.get()));
      break;
    case ssl_test_ticket_aead_seal_fail:
      abort();
      break;
    case ssl_test_ticket_aead_open_hard_fail:
      EXPECT_FALSE(client);
      break;
    case ssl_test_ticket_aead_open_soft_fail:
      ASSERT_TRUE(client);
      EXPECT_FALSE(SSL_session_reused(client.get()));
      EXPECT_FALSE(SSL_session_reused(server.get()));
  }
}